

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSemi.c
# Opt level: O2

int Ssw_SemCheckTargets(Ssw_Sem_t *p)

{
  Aig_Man_t *pAVar1;
  Aig_Obj_t **ppAVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  int i;
  
  i = 0;
  do {
    if (p->vTargets->nSize <= i) {
      return 0;
    }
    pvVar3 = Vec_PtrEntry(p->vTargets,i);
    pAVar1 = p->pMan->pAig;
    ppAVar2 = pAVar1->pReprs;
    if (ppAVar2 == (Aig_Obj_t **)0x0) {
      pAVar4 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar4 = ppAVar2[*(int *)((long)pvVar3 + 0x24)];
    }
    i = i + 1;
  } while (pAVar4 == pAVar1->pConst1);
  return 1;
}

Assistant:

int Ssw_SemCheckTargets( Ssw_Sem_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTargets, pObj, i )
        if ( !Ssw_ObjIsConst1Cand(p->pMan->pAig, pObj) )
            return 1;
    return 0;
}